

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int iVar1;
  U32 UVar2;
  U32 UVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  BYTE *local_288;
  BYTE *local_278;
  searchMax_f local_268;
  BYTE *local_260;
  BYTE *local_240;
  BYTE *local_230;
  BYTE *local_210;
  BYTE *local_200;
  BYTE *local_1f8;
  BYTE *local_1e8;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  BYTE *repEnd_3;
  BYTE *repMatch_3;
  BYTE *repBase_3;
  U32 repIndex_3;
  size_t litLength;
  BYTE *mStart;
  BYTE *match;
  U32 matchIndex;
  int gain1_3;
  int gain2_3;
  size_t ml2_2;
  size_t offset2_1;
  int gain1_2;
  int gain2_2;
  size_t repLength_1;
  BYTE *repEnd_2;
  BYTE *repMatch_2;
  BYTE *repBase_2;
  int local_130;
  U32 repIndex_2;
  int gain1_1;
  int gain2_1;
  size_t ml2_1;
  size_t offset2;
  int gain1;
  int gain2;
  size_t repLength;
  BYTE *repEnd_1;
  BYTE *repMatch_1;
  BYTE *repBase_1;
  ulong uStack_e8;
  U32 repIndex_1;
  size_t ml2;
  size_t offsetFound;
  BYTE *repEnd;
  BYTE *repMatch;
  BYTE *repBase;
  U32 repIndex;
  U32 current;
  BYTE *start;
  size_t offset;
  size_t matchLength;
  U32 offset_2;
  U32 offset_1;
  searchMax_f searchMax;
  BYTE *dictStart;
  BYTE *dictEnd;
  BYTE *dictBase;
  BYTE *prefixStart;
  U32 lowestIndex;
  U32 dictLimit;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  size_t local_30;
  void *local_28;
  U32 *local_20;
  seqStore_t *local_18;
  ZSTD_matchState_t *local_10;
  
  istart._4_4_ = 0;
  istart._0_4_ = 0;
  ilimit = (BYTE *)((long)src + srcSize);
  base = ilimit + -8;
  _lowestIndex = (ms->window).base;
  prefixStart._4_4_ = (ms->window).dictLimit;
  prefixStart._0_4_ = (ms->window).lowLimit;
  dictBase = _lowestIndex + prefixStart._4_4_;
  dictEnd = (ms->window).dictBase;
  dictStart = dictEnd + prefixStart._4_4_;
  searchMax = (searchMax_f)(dictEnd + (uint)prefixStart);
  _offset_2 = ZSTD_HcFindBestMatch_extDict_selectMLS;
  matchLength._4_4_ = *rep;
  matchLength._0_4_ = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  anchor = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == dictBase));
  iend = (BYTE *)src;
  ip = (BYTE *)src;
  local_30 = srcSize;
  local_28 = src;
  local_20 = rep;
  local_18 = seqStore;
  local_10 = ms;
LAB_0018f300:
  do {
    if (base <= anchor) {
      *local_20 = matchLength._4_4_;
      local_20[1] = (U32)matchLength;
      return (long)ilimit - (long)iend;
    }
    offset = 0;
    start = (BYTE *)0x0;
    _repIndex = anchor + 1;
    repBase._4_4_ = (int)anchor - (int)_lowestIndex;
    repBase._0_4_ = (repBase._4_4_ + 1) - matchLength._4_4_;
    if ((uint)repBase < prefixStart._4_4_) {
      local_1e8 = dictEnd;
    }
    else {
      local_1e8 = _lowestIndex;
    }
    repMatch = local_1e8;
    repEnd = local_1e8 + (uint)repBase;
    if (2 < (prefixStart._4_4_ - 1) - (uint)repBase && (uint)prefixStart < (uint)repBase) {
      UVar2 = MEM_read32(anchor + 1);
      UVar3 = MEM_read32(repEnd);
      if (UVar2 != UVar3) goto LAB_0018f476;
      if ((uint)repBase < prefixStart._4_4_) {
        local_1f8 = dictStart;
      }
      else {
        local_1f8 = ilimit;
      }
      offsetFound = (size_t)local_1f8;
      sVar5 = ZSTD_count_2segments(anchor + 5,repEnd + 4,ilimit,local_1f8,dictBase);
      offset = sVar5 + 4;
      if ((int)istart != 0) goto LAB_0018f476;
LAB_0018fc00:
      ZSTD_storeSeq(local_18,(long)_repIndex - (long)iend,iend,(U32)start,offset - 3);
      for (anchor = _repIndex + offset; iend = anchor, anchor <= base; anchor = anchor + offset) {
        uVar4 = ((int)anchor - (int)_lowestIndex) - (U32)matchLength;
        if (uVar4 < prefixStart._4_4_) {
          local_278 = dictEnd;
        }
        else {
          local_278 = _lowestIndex;
        }
        if ((prefixStart._4_4_ - 1) - uVar4 < 3 || uVar4 <= (uint)prefixStart) break;
        UVar2 = MEM_read32(anchor);
        UVar3 = MEM_read32(local_278 + uVar4);
        if (UVar2 != UVar3) break;
        if (uVar4 < prefixStart._4_4_) {
          local_288 = dictStart;
        }
        else {
          local_288 = ilimit;
        }
        sVar5 = ZSTD_count_2segments(anchor + 4,local_278 + uVar4 + 4,ilimit,local_288,dictBase);
        uVar4 = (U32)matchLength;
        offset = sVar5 + 4;
        start = (BYTE *)(ulong)(U32)matchLength;
        matchLength._0_4_ = matchLength._4_4_;
        matchLength._4_4_ = uVar4;
        ZSTD_storeSeq(local_18,0,iend,0,sVar5 + 1);
      }
      goto LAB_0018f300;
    }
LAB_0018f476:
    ml2 = 999999999;
    uStack_e8 = (*_offset_2)(local_10,anchor,ilimit,&ml2);
    if (offset < uStack_e8) {
      _repIndex = anchor;
      start = (BYTE *)ml2;
      offset = uStack_e8;
    }
    if (3 < offset) {
      if ((int)istart != 0) {
        while (anchor < base) {
          anchor = anchor + 1;
          repBase._4_4_ = repBase._4_4_ + 1;
          if (start != (BYTE *)0x0) {
            repBase_1._4_4_ = repBase._4_4_ - matchLength._4_4_;
            if (repBase_1._4_4_ < prefixStart._4_4_) {
              local_200 = dictEnd;
            }
            else {
              local_200 = _lowestIndex;
            }
            repMatch_1 = local_200;
            repEnd_1 = local_200 + repBase_1._4_4_;
            if (2 < (prefixStart._4_4_ - 1) - repBase_1._4_4_ && (uint)prefixStart < repBase_1._4_4_
               ) {
              UVar2 = MEM_read32(anchor);
              UVar3 = MEM_read32(repEnd_1);
              if (UVar2 == UVar3) {
                if (repBase_1._4_4_ < prefixStart._4_4_) {
                  local_210 = dictStart;
                }
                else {
                  local_210 = ilimit;
                }
                repLength = (size_t)local_210;
                sVar5 = ZSTD_count_2segments(anchor + 4,repEnd_1 + 4,ilimit,local_210,dictBase);
                _gain1 = sVar5 + 4;
                offset2._4_4_ = (int)_gain1 * 3;
                iVar1 = (int)offset;
                UVar2 = ZSTD_highbit32((int)start + 1);
                offset2._0_4_ = (iVar1 * 3 - UVar2) + 1;
                if ((3 < _gain1) && ((int)offset2 < offset2._4_4_)) {
                  offset = _gain1;
                  start = (BYTE *)0x0;
                  _repIndex = anchor;
                }
              }
            }
          }
          ml2_1 = 999999999;
          _gain1_1 = (*_offset_2)(local_10,anchor,ilimit,&ml2_1);
          lVar6 = _gain1_1 << 2;
          UVar2 = ZSTD_highbit32((int)ml2_1 + 1);
          repIndex_2 = (int)lVar6 - UVar2;
          lVar6 = offset << 2;
          UVar2 = ZSTD_highbit32((int)start + 1);
          local_130 = ((int)lVar6 - UVar2) + 4;
          if ((_gain1_1 < 4) || ((int)repIndex_2 <= local_130)) {
            if (((int)istart != 2) || (base <= anchor)) break;
            anchor = anchor + 1;
            repBase._4_4_ = repBase._4_4_ + 1;
            if (start != (BYTE *)0x0) {
              repBase_2._4_4_ = repBase._4_4_ - matchLength._4_4_;
              if (repBase_2._4_4_ < prefixStart._4_4_) {
                local_230 = dictEnd;
              }
              else {
                local_230 = _lowestIndex;
              }
              repMatch_2 = local_230;
              repEnd_2 = local_230 + repBase_2._4_4_;
              if (2 < (prefixStart._4_4_ - 1) - repBase_2._4_4_ &&
                  (uint)prefixStart < repBase_2._4_4_) {
                UVar2 = MEM_read32(anchor);
                UVar3 = MEM_read32(repEnd_2);
                if (UVar2 == UVar3) {
                  if (repBase_2._4_4_ < prefixStart._4_4_) {
                    local_240 = dictStart;
                  }
                  else {
                    local_240 = ilimit;
                  }
                  repLength_1 = (size_t)local_240;
                  sVar5 = ZSTD_count_2segments(anchor + 4,repEnd_2 + 4,ilimit,local_240,dictBase);
                  _gain1_2 = sVar5 + 4;
                  offset2_1._4_4_ = (int)_gain1_2 * 4;
                  lVar6 = offset << 2;
                  UVar2 = ZSTD_highbit32((int)start + 1);
                  offset2_1._0_4_ = ((int)lVar6 - UVar2) + 1;
                  if ((3 < _gain1_2) && ((int)offset2_1 < offset2_1._4_4_)) {
                    offset = _gain1_2;
                    start = (BYTE *)0x0;
                    _repIndex = anchor;
                  }
                }
              }
            }
            ml2_2 = 999999999;
            uVar7 = (*_offset_2)(local_10,anchor,ilimit,&ml2_2);
            UVar2 = ZSTD_highbit32((int)ml2_2 + 1);
            lVar6 = offset << 2;
            UVar3 = ZSTD_highbit32((int)start + 1);
            if ((uVar7 < 4) || ((int)((int)(uVar7 << 2) - UVar2) <= (int)(((int)lVar6 - UVar3) + 7))
               ) break;
            start = (BYTE *)ml2_2;
            _repIndex = anchor;
            offset = uVar7;
          }
          else {
            start = (BYTE *)ml2_1;
            _repIndex = anchor;
            offset = _gain1_1;
          }
        }
      }
      if (start != (BYTE *)0x0) {
        uVar4 = ((int)_repIndex - (int)_lowestIndex) - ((int)start + -2);
        if (uVar4 < prefixStart._4_4_) {
          local_260 = dictEnd + uVar4;
        }
        else {
          local_260 = _lowestIndex + uVar4;
        }
        mStart = local_260;
        if (uVar4 < prefixStart._4_4_) {
          local_268 = searchMax;
        }
        else {
          local_268 = (searchMax_f)dictBase;
        }
        while( true ) {
          bVar8 = false;
          if ((iend < _repIndex) && (bVar8 = false, local_268 < mStart)) {
            bVar8 = _repIndex[-1] == mStart[-1];
          }
          if (!bVar8) break;
          _repIndex = _repIndex + -1;
          mStart = mStart + -1;
          offset = offset + 1;
        }
        matchLength._0_4_ = matchLength._4_4_;
        matchLength._4_4_ = (int)start - 2;
      }
      goto LAB_0018fc00;
    }
    anchor = anchor + ((long)anchor - (long)iend >> 8) + 1;
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, 0, 0);
}